

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeKeyedService>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::ChromeKeyedService> *this,
          CopyablePtr<perfetto::protos::gen::ChromeKeyedService> *other)

{
  _Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false> this_00;
  
  (this->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  .super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>._M_head_impl;
  (other->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  .super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>._M_head_impl =
       (ChromeKeyedService *)0x0;
  this_00._M_head_impl = (ChromeKeyedService *)operator_new(0x50);
  perfetto::protos::gen::ChromeKeyedService::ChromeKeyedService(this_00._M_head_impl);
  _Var1._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>._M_head_impl;
  (other->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  .super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (_Var1._M_head_impl != (ChromeKeyedService *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_CppMessageObj + 8))();
    return;
  }
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }